

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-vocab.cpp
# Opt level: O2

int32_t __thiscall
llama_vocab::impl::detokenize
          (impl *this,llama_token *tokens,int32_t n_tokens,char *text,int32_t text_len_max,
          bool remove_special,bool unparse_special)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  int32_t length;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  undefined8 uVar9;
  long lVar10;
  byte bVar11;
  ulong uVar12;
  uint local_3c;
  
  if (this->type == LLAMA_VOCAB_TYPE_NONE) {
    uVar2 = 0;
  }
  else {
    if ((this->tokenizer)._M_t.
        super___uniq_ptr_impl<llm_tokenizer,_std::default_delete<llm_tokenizer>_>._M_t.
        super__Tuple_impl<0UL,_llm_tokenizer_*,_std::default_delete<llm_tokenizer>_>.
        super__Head_base<0UL,_llm_tokenizer_*,_false>._M_head_impl == (llm_tokenizer *)0x0) {
      pcVar4 = 
      "tokenizer && \"Tokenizer not initialized. Call llama_vocab::init_tokenizer() first.\"";
      uVar9 = 0xa4f;
LAB_00251803:
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-vocab.cpp"
                 ,uVar9,"GGML_ASSERT(%s) failed",pcVar4);
    }
    bVar11 = this->add_space_prefix;
    if (remove_special) {
      if (((0 < n_tokens) && (this->add_bos != false)) && (*tokens == this->special_bos_id)) {
        n_tokens = n_tokens - 1;
        tokens = tokens + 1;
        bVar11 = 0;
      }
      if (((0 < n_tokens & this->add_eos) == 1) && (tokens[n_tokens - 1U] == this->special_eos_id))
      {
        n_tokens = n_tokens - 1U;
      }
    }
    uVar12 = 0;
    uVar8 = (ulong)(uint)n_tokens;
    if (n_tokens < 1) {
      uVar8 = uVar12;
    }
    uVar2 = (uint)bVar11;
    local_3c = 0;
    length = text_len_max;
    for (; uVar8 != uVar12; uVar12 = uVar12 + 1) {
      if (length < 0) {
        pcVar4 = "avail >= 0";
        uVar9 = 0xa66;
        goto LAB_00251803;
      }
      uVar2 = token_to_piece(this,tokens[uVar12],text,length,uVar2,unparse_special);
      if ((int)uVar2 < 0) {
        local_3c = local_3c - uVar2;
        length = 0;
      }
      else if (uVar2 != 0) {
        length = length - uVar2;
        text = text + uVar2;
        local_3c = local_3c + uVar2;
      }
      uVar2 = 0;
    }
    if (text_len_max < (int)local_3c) {
      uVar2 = -local_3c;
    }
    else {
      uVar6 = local_3c;
      if (this->clean_spaces == true) {
        uVar2 = (uint)(local_3c != 0);
        for (lVar5 = 1; lVar5 < (int)local_3c; lVar5 = lVar5 + 1) {
          bVar11 = text[lVar5 - (ulong)local_3c];
          if (((text[lVar5 + (-1 - (ulong)local_3c)] == ' ') && (bVar11 < 0x40)) &&
             ((0x8000500200000000U >> ((ulong)(uint)bVar11 & 0x3f) & 1) != 0)) {
            uVar2 = uVar2 - 1;
          }
          lVar10 = (long)(int)uVar2;
          uVar2 = uVar2 + 1;
          text[lVar10 - (ulong)local_3c] = bVar11;
        }
        uVar3 = (uint)(uVar2 != 0);
        for (uVar8 = 1; (int)uVar8 < (int)uVar2; uVar8 = (ulong)((int)uVar8 + 1)) {
          lVar5 = (long)(int)uVar8;
          cVar1 = text[lVar5 - (ulong)local_3c];
          if ((((cVar1 == '\'') && (uVar12 = lVar5 + 1, (int)uVar12 < (int)uVar2)) &&
              (text[lVar5 + (-1 - (ulong)local_3c)] == ' ')) && (text[uVar12 - local_3c] == ' ')) {
            uVar3 = uVar3 - 1;
            text[uVar12 - local_3c] = '\0';
            uVar8 = uVar12;
          }
          lVar5 = (long)(int)uVar3;
          uVar3 = uVar3 + 1;
          text[lVar5 - (ulong)local_3c] = cVar1;
        }
        uVar6 = (uint)(uVar3 != 0);
        iVar7 = 2;
        for (lVar5 = 1; lVar5 < (int)uVar3; lVar5 = lVar5 + 1) {
          if (((text[lVar5 + (-1 - (ulong)local_3c)] == ' ') &&
              (text[lVar5 - (ulong)local_3c] == '\'')) &&
             ((iVar7 < (int)uVar3 &&
              (bVar11 = text[lVar5 + (1 - (ulong)local_3c)], (bVar11 & 0xef) != 100)))) {
            if ((bVar11 == 0x73) || (bVar11 == 0x6d)) {
              uVar6 = uVar6 - 1;
            }
            else if ((iVar7 + 1 < (int)uVar3) &&
                    ((bVar11 != 0x6c || (text[lVar5 + (2 - (ulong)local_3c)] != 'l')))) {
              uVar6 = uVar6 - ((bVar11 & 0xfb) == 0x72 && text[lVar5 + (2 - (ulong)local_3c)] == 'e'
                              );
            }
          }
          lVar10 = (long)(int)uVar6;
          uVar6 = uVar6 + 1;
          text[lVar10 - (ulong)local_3c] = text[lVar5 - (ulong)local_3c];
          iVar7 = iVar7 + 1;
        }
      }
      uVar2 = -uVar6;
      if ((int)uVar6 <= text_len_max) {
        uVar2 = uVar6;
      }
    }
  }
  return uVar2;
}

Assistant:

int32_t llama_vocab::impl::detokenize(
               const llama_token * tokens,
                         int32_t   n_tokens,
                            char * text,
                         int32_t   text_len_max,
                            bool   remove_special,
                            bool   unparse_special) const {
    if (type == LLAMA_VOCAB_TYPE_NONE) {
        return 0;
    }

    GGML_ASSERT(tokenizer && "Tokenizer not initialized. Call llama_vocab::init_tokenizer() first.");

    int32_t avail = text_len_max;
    int32_t total = 0;

    // remove the leading space
    bool remove_space = add_space_prefix;

    if (remove_special && add_bos) {
        if (n_tokens > 0 && tokens[0] == special_bos_id) {
            remove_space = false;
            n_tokens--;
            tokens++;
        }
    }

    if (remove_special && add_eos) {
        if (n_tokens > 0 && tokens[n_tokens - 1] == special_eos_id) {
            n_tokens--;
        }
    }

    for (int32_t i = 0; i < n_tokens; ++i) {
        GGML_ASSERT(avail >= 0);
        int32_t n_chars = token_to_piece(tokens[i], text, avail, remove_space, unparse_special);
        remove_space = false;
        if (n_chars < 0) {
            avail = 0;
            total -= n_chars;
        } else if (n_chars > 0) {
            avail -= n_chars;
            text  += n_chars;
            total += n_chars;
        }
    }

    if (total > text_len_max) {
        return -total;
    }

    if (clean_spaces) {
        text -= total;  // restart text

        // first pass: characters ?!.,  //TODO: where do these characters come from?
        const int32_t total1 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total1; ++i) {
            const char x = text[i];
            if (text[i - 1] == ' ') {
                if (x == '?' || x == '!' || x == '.' || x == ',') {  // " ?", " !", " .", " ,"
                    total--;  // remove space
                }
            }
            text[total++] = x;
        }

        // second pass: strip single apostrophe between spaces
        const int32_t total2 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total2; ++i) {
            const char x = text[i];
            if (x == '\'' && i + 1 < total2 && text[i - 1] == ' ' && text[i + 1] == ' ') {  // " ' "
                total--;           // remove prev space
                text[++i] = '\0';  // remove next space
            }
            text[total++] = x;
        }

        // third pass: apostrophe contractions  //NOTE: this makes sense?
        const int32_t total3 = total;
        total = total ? 1 : 0;
        for (int32_t i = 1; i < total3; ++i) {
            const char x = text[i];
            if (text[i - 1] == ' ') {
                if (x == '\'' && i + 1 < total3) {
                    const char x1 = text[i + 1];
                    if (x1 == 't' || x1 == 'd') {  // " 't", " 'd"
                        //total--;  // remove space
                    } else if (x1 == 's' || x1 == 'm') {  // " 's", " 'm"
                        total--;  // remove space
                    } else if (i + 2 < total3) {
                        const char x2 = text[i + 2];
                        if ((x1 == 'l' && x2 == 'l')) {  // " 'll"
                            //total--;  // remove space
                        } else if ((x1 == 'r' && x2 == 'e') || (x1 == 'v' && x2 == 'e')) {  // " 're", " 've"
                            total--;  // remove space
                        } else {
                            //total--;  // remove space
                        }
                    } else {
                        //total--;  // remove space
                    }
                }
            }
            text[total++] = x;
        }
    }

    return total <= text_len_max ? total : -total;
}